

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

string * random_id_abi_cxx11_(string *__return_storage_ptr__,int len)

{
  int iVar1;
  ulong uVar2;
  string *psVar3;
  uint uVar4;
  result_type rVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 in_register_00000034;
  allocator local_2759;
  ulong local_2758;
  string *local_2750;
  uniform_int_distribution<int> dis;
  random_device rd;
  mt19937 gen;
  
  local_2758 = CONCAT44(in_register_00000034,len);
  local_2750 = __return_storage_ptr__;
  std::random_device::random_device(&rd);
  uVar4 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar4);
  uVar2 = local_2758;
  dis._M_param._M_a = 0;
  dis._M_param._M_b = 0x3d;
  iVar1 = (int)local_2758;
  iVar7 = -1;
  if (-2 < iVar1) {
    iVar7 = iVar1 + 1;
  }
  pcVar6 = (char *)operator_new__((long)iVar7);
  uVar9 = 0;
  uVar8 = 0;
  if (0 < iVar1) {
    uVar8 = uVar2 & 0xffffffff;
  }
  for (; psVar3 = local_2750, uVar8 != uVar9; uVar9 = uVar9 + 1) {
    rVar5 = std::uniform_int_distribution<int>::operator()(&dis,&gen);
    pcVar6[uVar9] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar5];
  }
  pcVar6[(int)local_2758] = '\0';
  std::__cxx11::string::string((string *)local_2750,pcVar6,&local_2759);
  operator_delete__(pcVar6);
  std::random_device::~random_device(&rd);
  return psVar3;
}

Assistant:

string random_id(const int len) {
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, alphanumlen - 1);

    auto *s = new char[len + 1];
    int rand_idx;
    for (int i = 0; i < len; ++i) {
        rand_idx = dis(gen);
        s[i] = alphanum[rand_idx];
    }
    s[len] = 0;
    string retval(s);
    delete [] s;
    return retval;
}